

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O3

int ncnn::deconvolution1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  float *pfVar16;
  void *pvVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  float fVar28;
  int iVar29;
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  uVar2 = top_blob->h;
  pvVar6 = bias_data->data;
  if (pvVar6 == (void *)0x0) {
    bVar22 = true;
    lVar12 = 0;
  }
  else {
    lVar12 = (long)bias_data->c * bias_data->cstep;
    bVar22 = lVar12 == 0;
  }
  iVar11 = (int)lVar12;
  if (0 < (int)uVar2) {
    uVar3 = top_blob->w;
    uVar4 = bottom_blob->w;
    uVar5 = bottom_blob->h;
    pfVar19 = (float *)top_blob->data;
    pvVar7 = weight_data->data;
    lVar12 = (ulong)uVar3 - 1;
    auVar30._8_4_ = (int)lVar12;
    auVar30._0_8_ = lVar12;
    auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = (long)(int)uVar3 * top_blob->elemsize;
    auVar30 = auVar30 ^ _DAT_005a42f0;
    pfVar15 = pfVar19 + 3;
    iVar11 = 0;
    uVar14 = 0;
    auVar32 = _DAT_005a43f0;
    auVar33 = _DAT_005a4400;
    auVar34 = _DAT_005a42f0;
    do {
      fVar24 = 0.0;
      if (!bVar22) {
        fVar24 = *(float *)((long)pvVar6 + uVar14 * 4);
      }
      if (0 < (int)uVar3) {
        uVar13 = 0;
        do {
          auVar25._8_4_ = (int)uVar13;
          auVar25._0_8_ = uVar13;
          auVar25._12_4_ = (int)(uVar13 >> 0x20);
          auVar26 = (auVar25 | auVar33) ^ auVar34;
          iVar29 = auVar30._0_4_;
          bVar10 = iVar29 < auVar26._0_4_;
          iVar27 = auVar26._4_4_;
          iVar31 = auVar30._4_4_;
          if ((bool)(~(iVar31 < iVar27 || iVar27 == iVar31 && bVar10) & 1)) {
            pfVar15[uVar13 - 3] = fVar24;
          }
          if (iVar31 >= iVar27 && (iVar27 != iVar31 || !bVar10)) {
            pfVar15[uVar13 - 2] = fVar24;
          }
          auVar25 = (auVar25 | auVar32) ^ auVar34;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar31 && (iVar27 != iVar31 || auVar25._0_4_ <= iVar29)) {
            pfVar15[uVar13 - 1] = fVar24;
            pfVar15[uVar13] = fVar24;
          }
          uVar13 = uVar13 + 4;
        } while ((uVar3 + 3 & 0xfffffffc) != uVar13);
      }
      if (0 < (int)uVar4) {
        pvVar8 = bottom_blob->data;
        iVar27 = bottom_blob->w;
        sVar9 = bottom_blob->elemsize;
        uVar13 = 0;
        pfVar16 = pfVar19;
        do {
          if (0 < (int)uVar5) {
            uVar18 = 0;
            pvVar17 = (void *)((long)pvVar7 + (long)iVar11 * 4);
            do {
              if (0 < kernel_w) {
                fVar24 = *(float *)((long)pvVar8 + (long)iVar27 * sVar9 * uVar18 + uVar13 * 4);
                uVar21 = 0;
                pfVar20 = pfVar16;
                do {
                  *pfVar20 = *(float *)((long)pvVar17 + uVar21 * 4) * fVar24 + *pfVar20;
                  uVar21 = uVar21 + 1;
                  pfVar20 = pfVar20 + dilation_w;
                } while ((uint)kernel_w != uVar21);
              }
              uVar18 = uVar18 + 1;
              pvVar17 = (void *)((long)pvVar17 + (long)kernel_w * 4);
            } while (uVar18 != uVar5);
          }
          uVar13 = uVar13 + 1;
          pfVar16 = pfVar16 + stride_w;
        } while (uVar13 != uVar4);
      }
      if (0 < (int)uVar3) {
        pfVar16 = (float *)activation_params->data;
        uVar13 = 0;
        do {
          fVar24 = pfVar19[uVar13];
          fVar23 = fVar24;
          switch(activation_type) {
          case 1:
            if (fVar24 <= 0.0) {
              fVar23 = 0.0;
            }
            break;
          case 2:
            fVar23 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar16 |
                            -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
            break;
          case 3:
            if (fVar24 <= *pfVar16) {
              fVar24 = *pfVar16;
            }
            fVar23 = pfVar16[1];
            if (fVar24 <= pfVar16[1]) {
              fVar23 = fVar24;
            }
            break;
          case 4:
            if (88.37626 <= fVar24) {
              fVar24 = 88.37626;
            }
            fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar24 < -88.37626) & ((uint)fVar24 ^ auVar34._0_4_)));
            auVar32 = _DAT_005a43f0;
            auVar33 = _DAT_005a4400;
            auVar34 = _DAT_005a42f0;
            fVar23 = 1.0 / (fVar24 + 1.0);
            break;
          case 5:
            fVar23 = expf(fVar24);
            fVar23 = logf(fVar23 + 1.0);
            fVar23 = tanhf(fVar23);
            auVar32 = _DAT_005a43f0;
            auVar33 = _DAT_005a4400;
            auVar34 = _DAT_005a42f0;
            fVar23 = fVar23 * fVar24;
            break;
          case 6:
            fVar1 = *pfVar16;
            fVar28 = (float)((uint)pfVar16[1] ^ auVar34._0_4_) / fVar1;
            fVar23 = 0.0;
            if ((fVar28 <= fVar24) && (fVar23 = fVar24, fVar24 <= fVar28 + 1.0 / fVar1)) {
              fVar23 = (fVar1 * fVar24 + pfVar16[1]) * fVar24;
            }
          }
          pfVar19[uVar13] = fVar23;
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
      uVar14 = uVar14 + 1;
      pfVar15 = (float *)((long)pfVar15 + lVar12);
      pfVar19 = (float *)((long)pfVar19 + lVar12);
      iVar11 = iVar11 + uVar5 * kernel_w;
    } while (uVar14 != uVar2);
  }
  return iVar11;
}

Assistant:

static int deconvolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        Mat out = top_blob.row_range(p, 1);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int j = 0; j < w; j++)
        {
            float* outptr = (float*)out + j * stride_w;

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float val = bottom_blob.row(q)[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }

                kptr += kernel_w;
            }
        }

        {
            float* outptr = out;

            for (int i = 0; i < outw; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}